

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  size_t id;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  db;
  Server svr;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> bStack_3f8;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  local_3d8;
  _Any_data local_398;
  code *local_388;
  code *pcStack_380;
  _Any_data local_378;
  code *local_368;
  code *pcStack_360;
  _Any_data local_358;
  code *local_348;
  code *pcStack_340;
  _Any_data local_338;
  code *local_328;
  code *pcStack_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  undefined8 local_2f0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  undefined1 local_2b8 [256];
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  local_1b8 [96];
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  local_158 [48];
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  local_128 [240];
  code *local_38 [2];
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  local_2b8._176_8_ = local_2b8 + 0xa0;
  local_2b8._0_8_ = &PTR__Server_0014e460;
  local_2b8._8_8_ = (void *)0x0;
  local_2b8._16_8_ = 0;
  local_2b8._32_8_ =
       std::
       _Function_handler<httplib::TaskQueue_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4107:13)>
       ::_M_invoke;
  local_2b8._24_8_ =
       std::
       _Function_handler<httplib::TaskQueue_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp:4107:13)>
       ::_M_manager;
  local_2b8._40_4_ = -1;
  local_2b8._48_8_ = 5;
  local_2b8._56_8_ = 5;
  local_2b8._64_8_ = 5;
  local_2b8._72_8_ = 0;
  local_2b8._80_8_ = 5;
  local_2b8._88_8_ = 0;
  local_2b8._96_8_ = 0;
  local_2b8._104_8_ = 0;
  local_2b8._112_8_ = 0xffffffffffffffff;
  local_2b8._160_4_ = _S_red;
  local_2b8._168_8_ = (_Base_ptr)0x0;
  local_2b8._120_8_ = (pointer)0x0;
  local_2b8[0x80] = 0;
  local_2b8._129_7_ = 0;
  local_2b8[0x88] = 0;
  local_2b8._137_8_ = 0;
  local_28 = (_Manager_type)0x0;
  p_Stack_20 = (_Invoker_type)0x0;
  local_38[0] = (code *)0x0;
  local_38[1] = (code *)0x0;
  local_2b8._184_8_ = local_2b8._176_8_;
  memset(local_2b8 + 0xc0,0,0x1b9);
  local_38[0] = httplib::default_socket_options;
  p_Stack_20 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  local_28 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  signal(0xd,(__sighandler_t)0x1);
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f0 = 0;
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_300 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:36:15)>
              ::_M_invoke;
  local_308 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:36:15)>
              ::_M_manager;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&bStack_3f8,"/",0x10);
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  ::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>,_true>
            (&local_3d8,&bStack_3f8,
             (function<void_(const_httplib::Request_&,_httplib::Response_&)> *)&local_318);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  ::
  emplace_back<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>
            ((vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
              *)(local_2b8 + 0xe8),&local_3d8);
  if (local_3d8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_3d8.second,(_Any_data *)&local_3d8.second,__destroy_functor);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_3d8.first)
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&bStack_3f8);
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,__destroy_functor);
  }
  local_338._8_8_ = 0;
  pcStack_320 = std::
                _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:41:27)>
                ::_M_invoke;
  local_328 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:41:27)>
              ::_M_manager;
  local_338._M_unused._M_object = &local_2e8;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&bStack_3f8,"/msg/(\\d+)",0x10);
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  ::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>,_true>
            (&local_3d8,&bStack_3f8,
             (function<void_(const_httplib::Request_&,_httplib::Response_&)> *)&local_338);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  ::
  emplace_back<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>
            ((vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
              *)(local_2b8 + 0xe8),&local_3d8);
  if (local_3d8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_3d8.second,(_Any_data *)&local_3d8.second,__destroy_functor);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_3d8.first)
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&bStack_3f8);
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,__destroy_functor);
  }
  local_398._8_8_ = &local_2f0;
  pcStack_380 = std::
                _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:61:16)>
                ::_M_invoke;
  local_388 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:61:16)>
              ::_M_manager;
  local_398._M_unused._M_object = &local_2e8;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&bStack_3f8,"/",0x10);
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  ::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>,_true>
            (&local_3d8,&bStack_3f8,
             (function<void_(const_httplib::Request_&,_httplib::Response_&)> *)&local_398);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  ::
  emplace_back<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>
            (local_1b8,&local_3d8);
  if (local_3d8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_3d8.second,(_Any_data *)&local_3d8.second,__destroy_functor);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_3d8.first)
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&bStack_3f8);
  if (local_388 != (code *)0x0) {
    (*local_388)(&local_398,&local_398,__destroy_functor);
  }
  local_358._8_8_ = 0;
  pcStack_340 = std::
                _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:83:17)>
                ::_M_invoke;
  local_348 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:83:17)>
              ::_M_manager;
  local_358._M_unused._M_object = &local_2e8;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&bStack_3f8,"/",0x10);
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  ::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>,_true>
            (&local_3d8,&bStack_3f8,
             (function<void_(const_httplib::Request_&,_httplib::Response_&)> *)&local_358);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  ::
  emplace_back<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>
            (local_158,&local_3d8);
  if (local_3d8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_3d8.second,(_Any_data *)&local_3d8.second,__destroy_functor);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_3d8.first)
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&bStack_3f8);
  if (local_348 != (code *)0x0) {
    (*local_348)(&local_358,&local_358,__destroy_functor);
  }
  local_378._8_8_ = 0;
  pcStack_360 = std::
                _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:103:30)>
                ::_M_invoke;
  local_368 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:103:30)>
              ::_M_manager;
  local_378._M_unused._M_object = &local_2e8;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&bStack_3f8,"/msg/(\\d+)",0x10);
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>
  ::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>,_true>
            (&local_3d8,&bStack_3f8,
             (function<void_(const_httplib::Request_&,_httplib::Response_&)> *)&local_378);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>,std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>>
  ::
  emplace_back<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(httplib::Request_const&,httplib::Response&)>>>
            (local_128,&local_3d8);
  if (local_3d8.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d8.second.super__Function_base._M_manager)
              ((_Any_data *)&local_3d8.second,(_Any_data *)&local_3d8.second,__destroy_functor);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_3d8.first)
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&bStack_3f8);
  if (local_368 != (code *)0x0) {
    (*local_368)(&local_378,&local_378,__destroy_functor);
  }
  iVar1 = httplib::Server::bind_internal((Server *)local_2b8,"0.0.0.0",0x1f90,0);
  if (-1 < iVar1) {
    httplib::Server::listen_internal((Server *)local_2b8);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2e8);
  httplib::Server::~Server((Server *)local_2b8);
  return 0;
}

Assistant:

int main(void)
{
	httplib::Server svr;

	std::map<size_t, std::string> db;
	size_t id = 0;

	svr.Get("/", [](const httplib::Request&, httplib::Response& res)
		{
			res.set_content("Hello World!", "text/plain");
		});

	svr.Get(R"(/msg/(\d+))", [&](const httplib::Request& req, httplib::Response& res)
		{
			auto n = req.matches[1];

			nlohmann::json jRes;

			try
			{
				jRes["id"] = std::stoi(n);
				jRes["msg"] = db[std::stoi(n)];

				res.set_content(jRes.dump(), "application/json");
			}
			catch (const std::exception&)
			{
				res.set_content("Cannot find the requested message.", "text/plain");
			}

		});

	svr.Post("/", [&](const httplib::Request& req, httplib::Response& res)
		{
			nlohmann::json json = nlohmann::json::parse(req.body);

			if (bValidReq(json, { "msg" }))
			{
				db.insert({ id, json["msg"] });

				nlohmann::json jRes;

				jRes["id"] = id;
				jRes["msg"] = db[id];

				id++;

				res.set_content(jRes.dump(), "application/json");
			}
			else
				res.set_content("The request doesn't meet the requirements", "text/plain");

		});

	svr.Patch("/", [&](const httplib::Request& req, httplib::Response& res)
		{
			nlohmann::json json = nlohmann::json::parse(req.body);

			if (bValidReq(json, { "id", "msg" }))
			{
				db[json["id"]] = json["msg"];

				nlohmann::json jRes;

				jRes["id"] = json["id"];
				jRes["msg"] = db[json["id"]];

				res.set_content(jRes.dump(), "application/json");
			}
			else
				res.set_content("The request doesn't meet the requirements", "text/plain");

		});

	svr.Delete(R"(/msg/(\d+))", [&](const httplib::Request& req, httplib::Response& res)
		{

			auto n = req.matches[1];

			db[std::stoi(n)] = "deleted";

			nlohmann::json jRes;

			jRes["id"] = std::stoi(n);
			jRes["msg"] = "deleted";

			res.set_content(jRes.dump(), "application/json");

		});


	svr.listen("0.0.0.0", 8080);
	return 0;
}